

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::InterlockedResourceAccessPrepassHandler::begin_function_scope
          (InterlockedResourceAccessPrepassHandler *this,uint32_t *args,uint32_t length)

{
  uint32_t length_local;
  uint32_t *args_local;
  InterlockedResourceAccessPrepassHandler *this_local;
  
  if (2 < length) {
    SmallVector<unsigned_int,_8UL>::push_back(&this->call_stack,args + 2);
  }
  return 2 < length;
}

Assistant:

bool Compiler::InterlockedResourceAccessPrepassHandler::begin_function_scope(const uint32_t *args, uint32_t length)
{
	if (length < 3)
		return false;
	call_stack.push_back(args[2]);
	return true;
}